

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O1

int lj_cf_rawequal(lua_State *L)

{
  uint uVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  int narg;
  bool bVar4;
  
  pTVar2 = L->base;
  pTVar3 = L->top;
  if (pTVar3 <= pTVar2) {
    narg = 1;
LAB_00141fd9:
    lj_err_arg(L,narg,LJ_ERR_NOVAL);
  }
  if (pTVar3 <= pTVar2 + 1) {
    narg = 2;
    goto LAB_00141fd9;
  }
  uVar1 = (pTVar2->field_2).it;
  if (uVar1 == *(uint *)((long)pTVar2 + 0xc)) {
    bVar4 = true;
    if (0xfffffffc < uVar1) goto LAB_00141fb9;
    if (0xfffefffe < uVar1) {
      bVar4 = (pTVar2->u32).lo == pTVar2[1].u32.lo;
      goto LAB_00141fb9;
    }
  }
  else if (0xfffeffff < *(uint *)((long)pTVar2 + 0xc) || 0xfffeffff < uVar1) {
    bVar4 = false;
    goto LAB_00141fb9;
  }
  bVar4 = (bool)(-(pTVar2[1].n == pTVar2->n) & 1);
LAB_00141fb9:
  *(uint *)((long)pTVar3 + -4) = -2 - (uint)bVar4;
  return 1;
}

Assistant:

LJLIB_CF(rawequal)		LJLIB_REC(.)
{
  cTValue *o1 = lj_lib_checkany(L, 1);
  cTValue *o2 = lj_lib_checkany(L, 2);
  setboolV(L->top-1, lj_obj_equal(o1, o2));
  return 1;
}